

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall QMainWindowLayout::plug(QMainWindowLayout *this,QLayoutItem *widgetItem)

{
  QMainWindowLayoutState *this_00;
  Representation RVar1;
  undefined8 *puVar2;
  int *piVar3;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  QLayout *pQVar8;
  QWidget *pQVar9;
  QPoint QVar10;
  QWidget *pQVar11;
  undefined4 extraout_var_00;
  QLayoutItem *pQVar12;
  QWidget *pQVar13;
  QDockWidgetLayout *this_01;
  QStyle *pQVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  QList<QDockWidgetGroupWindow_*> list;
  QList<QDockWidgetGroupWindow_*> list_1;
  QPoint local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  QList<int> local_78;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) ||
     (*(long *)(this + 0x7f8) == 0)) {
    pQVar11 = QLayout::parentWidget((QLayout *)this);
    if ((pQVar11->data->widget_attributes & 0x8000) != 0) {
      pQVar11 = QLayout::parentWidget((QLayout *)this);
      bVar5 = QWidget::isMinimized(pQVar11);
      if ((!bVar5) && (*(long *)(this + 0x7c0) != 0)) {
        fixToolBarOrientation(widgetItem,*(int *)(*(long *)(this + 0x7b8) + 4));
        iVar7 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
        pQVar11 = (QWidget *)CONCAT44(extraout_var_00,iVar7);
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (int *)0x0;
        local_58.d.size = 0;
        qt_qFindChildren_helper
                  (*(undefined8 *)(*(long *)(this + 8) + 0x10),0,0,
                   &QDockWidgetGroupWindow::staticMetaObject,&local_58,0);
        piVar3 = local_58.d.ptr;
        if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
          lVar16 = local_58.d.size << 3;
          lVar15 = 0;
          do {
            pQVar13 = *(QWidget **)((long)piVar3 + lVar15);
            local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar8 = QWidget::layout(pQVar13);
            QDockAreaLayoutInfo::indexOf
                      (&local_78,(QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,pQVar11);
            if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
              pQVar8 = QWidget::layout(pQVar13);
              QDockAreaLayoutInfo::remove
                        ((QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,(char *)&local_78);
            }
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
              }
            }
            lVar15 = lVar15 + 8;
          } while (lVar16 != lVar15);
        }
        this_00 = (QMainWindowLayoutState *)(this + 0x88);
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QMainWindowLayoutState::indexOf(&local_78,this_00,pQVar11);
        pQVar12 = QMainWindowLayoutState::plug(this_00,(QList<int> *)(this + 0x7b0));
        bVar5 = pQVar12 != (QLayoutItem *)0x0;
        if (bVar5) {
          if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
            QMainWindowLayoutState::remove(this_00,(char *)&local_78);
          }
          *(QWidget **)(this + 0x7d8) = pQVar11;
          local_98 = *(undefined1 (*) [8])(this + 0x7c8);
          uStack_90 = *(int **)(this + 2000);
          pQVar13 = QLayout::parentWidget((QLayout *)this);
          local_a0.xp.m_i = local_98._0_4_;
          local_a0.yp.m_i = local_98._4_4_;
          QVar10 = QWidget::mapToGlobal(pQVar13,&local_a0);
          uStack_90 = (int *)CONCAT44(uStack_90._4_4_ + (QVar10.yp.m_i.m_i - local_98._4_4_),
                                      uStack_90._0_4_ + (QVar10.xp.m_i.m_i - local_98._0_4_));
          local_98 = (undefined1  [8])QVar10;
          lVar15 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
          if (lVar15 != 0) {
            QWidget::layout(pQVar11);
            this_01 = (QDockWidgetLayout *)
                      QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
            bVar6 = QDockWidgetLayout::nativeWindowDeco(this_01);
            if (bVar6) {
              puVar2 = (undefined8 *)local_98;
              iVar7 = QDockWidgetLayout::titleHeight(this_01);
            }
            else {
              puVar2 = &uStack_90;
              pQVar14 = QWidget::style(pQVar11);
              iVar7 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x12,0,pQVar11);
              RVar1.m_i = local_98._4_4_;
              local_98._0_4_ = local_98._0_4_ - iVar7;
              local_98._4_4_ = RVar1.m_i - iVar7;
              uStack_90 = (int *)CONCAT44(uStack_90._4_4_,uStack_90._0_4_ + iVar7);
            }
            *(int *)((long)puVar2 + 4) = *(int *)((long)puVar2 + 4) + iVar7;
          }
          QWidgetAnimator::animate
                    ((QWidgetAnimator *)(this + 0x790),pQVar11,(QRect *)local_98,
                     (bool)((byte)*(undefined4 *)(this + 0x700) & 1));
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
          }
        }
        goto LAB_0043e153;
      }
    }
    bVar5 = false;
  }
  else {
    iVar7 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
    pQVar11 = (QWidget *)CONCAT44(extraout_var,iVar7);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QMainWindowLayoutState::indexOf(&local_58,(QMainWindowLayoutState *)(this + 0x88),pQVar11);
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      QMainWindowLayoutState::remove((QMainWindowLayoutState *)(this + 0x88),(char *)&local_58);
    }
    pQVar8 = QWidget::layout(*(QWidget **)(this + 0x7f8));
    QDockAreaLayoutInfo::indexOf
              (&local_78,(QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,pQVar11);
    pDVar4 = local_58.d.d;
    local_58.d.size = local_78.d.size;
    local_78.d.size = 0;
    local_58.d.d = local_78.d.d;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (int *)0x0;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,4,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
      }
    }
    local_78.d._0_16_ = ZEXT816(0);
    local_78.d.size = 0;
    qt_qFindChildren_helper
              (*(undefined8 *)(*(long *)(this + 8) + 0x10),0,0,
               &QDockWidgetGroupWindow::staticMetaObject,&local_78,0);
    if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
      piVar3 = local_78.d.ptr;
      lVar15 = local_78.d.size << 3;
      lVar16 = 0;
      do {
        pQVar13 = *(QWidget **)((long)piVar3 + lVar16);
        if ((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) {
          pQVar9 = (QWidget *)0x0;
        }
        else {
          pQVar9 = *(QWidget **)(this + 0x7f8);
        }
        if (pQVar9 != pQVar13) {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          uStack_90 = (int *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar8 = QWidget::layout(pQVar13);
          QDockAreaLayoutInfo::indexOf
                    ((QList<int> *)local_98,(QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,
                     pQVar11);
          if (local_88 != (undefined1 *)0x0) {
            pQVar8 = QWidget::layout(pQVar13);
            QDockAreaLayoutInfo::remove
                      ((QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,(char *)local_98);
          }
          if ((QPoint)local_98 != (QPoint)0x0) {
            LOCK();
            *(int *)local_98 = *(int *)local_98 + -1;
            UNLOCK();
            if (*(int *)local_98 == 0) {
              QArrayData::deallocate((QArrayData *)local_98,4,0x10);
            }
          }
        }
        lVar16 = lVar16 + 8;
      } while (lVar15 != lVar16);
    }
    *(undefined8 *)(this + 0x7c8) = 0;
    *(undefined8 *)(this + 2000) = 0xffffffffffffffff;
    QDockWidgetGroupWindow::apply(*(QDockWidgetGroupWindow **)(this + 0x7f8));
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      pQVar8 = QWidget::layout(*(QWidget **)(this + 0x7f8));
      QDockAreaLayoutInfo::remove
                ((QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,(char *)&local_58);
    }
    local_a0 = *(QPoint *)(*(long *)(this + 0x7f8) + 0x28);
    uStack_90 = *(int **)(*(long *)(this + 0x7f8) + 0x30);
    local_98 = (undefined1  [8])local_a0;
    QVar10 = QWidget::mapToGlobal(*(QWidget **)(this + 0x7f8),&local_a0);
    uStack_90 = (int *)CONCAT44(uStack_90._4_4_ + (QVar10.yp.m_i.m_i - local_98._4_4_),
                                uStack_90._0_4_ + (QVar10.xp.m_i.m_i - local_98._0_4_));
    *(QWidget **)(this + 0x7d8) = pQVar11;
    local_98 = (undefined1  [8])QVar10;
    QWidgetAnimator::animate
              ((QWidgetAnimator *)(this + 0x790),pQVar11,(QRect *)local_98,
               (bool)((byte)*(undefined4 *)(this + 0x700) & 1));
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
      }
    }
    bVar5 = true;
  }
LAB_0043e153:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayout::plug(QLayoutItem *widgetItem)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget) && QT_CONFIG(tabbar)
    if (currentHoveredFloat) {
        QWidget *widget = widgetItem->widget();
        QList<int> previousPath = layoutState.indexOf(widget);
        if (!previousPath.isEmpty())
            layoutState.remove(previousPath);
        previousPath = currentHoveredFloat->layoutInfo()->indexOf(widget);
        // Let's remove the widget from any possible group window
        const auto groups =
                parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
        for (QDockWidgetGroupWindow *dwgw : groups) {
            if (dwgw == currentHoveredFloat)
                continue;
            QList<int> path = dwgw->layoutInfo()->indexOf(widget);
            if (!path.isEmpty())
                dwgw->layoutInfo()->remove(path);
        }
        currentGapRect = QRect();
        currentHoveredFloat->apply();
        if (!previousPath.isEmpty())
            currentHoveredFloat->layoutInfo()->remove(previousPath);
        QRect globalRect = currentHoveredFloat->currentGapRect;
        globalRect.moveTopLeft(currentHoveredFloat->mapToGlobal(globalRect.topLeft()));
        pluggingWidget = widget;
        widgetAnimator.animate(widget, globalRect, dockOptions & QMainWindow::AnimatedDocks);
        return true;
    }
#endif

    if (!parentWidget()->isVisible() || parentWidget()->isMinimized() || currentGapPos.isEmpty())
        return false;

    fixToolBarOrientation(widgetItem, currentGapPos.at(1));

    QWidget *widget = widgetItem->widget();

#if QT_CONFIG(dockwidget)
    // Let's remove the widget from any possible group window
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> path = dwgw->layoutInfo()->indexOf(widget);
        if (!path.isEmpty())
            dwgw->layoutInfo()->remove(path);
    }
#endif

    QList<int> previousPath = layoutState.indexOf(widget);

    const QLayoutItem *it = layoutState.plug(currentGapPos);
    if (!it)
        return false;
    Q_ASSERT(it == widgetItem);
    if (!previousPath.isEmpty())
        layoutState.remove(previousPath);

    pluggingWidget = widget;
    QRect globalRect = currentGapRect;
    globalRect.moveTopLeft(parentWidget()->mapToGlobal(globalRect.topLeft()));
#if QT_CONFIG(dockwidget)
    if (qobject_cast<QDockWidget*>(widget) != nullptr) {
        QDockWidgetLayout *layout = qobject_cast<QDockWidgetLayout*>(widget->layout());
        if (layout->nativeWindowDeco()) {
            globalRect.adjust(0, layout->titleHeight(), 0, 0);
        } else {
            int fw = widget->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, widget);
            globalRect.adjust(-fw, -fw, fw, fw);
        }
    }
#endif
    widgetAnimator.animate(widget, globalRect, dockOptions & QMainWindow::AnimatedDocks);

    return true;
}